

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

string * __thiscall
Json::Value::toStyledString_abi_cxx11_(string *__return_storage_ptr__,Value *this)

{
  size_t sVar1;
  Value *in_RCX;
  char *__s;
  StreamWriterBuilder builder;
  string local_70;
  StreamWriterBuilder local_50;
  
  StreamWriterBuilder::StreamWriterBuilder(&local_50);
  if (this->comments_ == (CommentInfo *)0x0) {
    __s = "";
  }
  else {
    __s = "\n";
    if (this->comments_->comment_ == (char *)0x0) {
      __s = "";
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,__s + sVar1);
  writeString_abi_cxx11_(&local_70,(Json *)&local_50,(Factory *)this,in_RCX);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  StreamWriterBuilder::~StreamWriterBuilder(&local_50);
  return __return_storage_ptr__;
}

Assistant:

JSONCPP_STRING Value::toStyledString() const {
  StreamWriterBuilder builder;

  JSONCPP_STRING out = this->hasComment(commentBefore) ? "\n" : "";
  out += Json::writeString(builder, *this);
  out += "\n";

  return out;
}